

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O1

char * __thiscall
Memory::PageSegmentBase<Memory::VirtualAllocWrapper>::AllocDecommitPages<BVStatic<272ul>,true>
          (PageSegmentBase<Memory::VirtualAllocWrapper> *this,uint pageCount,
          BVStatic<272UL> freePages,BVStatic<272UL> decommitPages)

{
  PageBitVector *this_00;
  ulong *puVar1;
  uint uVar2;
  SecondaryAllocator *pSVar3;
  PageAllocatorBaseCommon *pPVar4;
  code *pcVar5;
  bool bVar6;
  BOOLEAN BVar7;
  BVIndex BVar8;
  int iVar9;
  BVIndex BVar10;
  uint uVar11;
  undefined4 *puVar12;
  char *pcVar13;
  long lVar14;
  AllocatorType *pAVar15;
  PageBitVector *this_01;
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  *this_02;
  BVIndex BVar16;
  char *unaff_R12;
  char *lpAddress;
  undefined1 auStack_88 [8];
  BVStatic<272UL> freeAndDecommitPages;
  
  BVar10 = this->freePageCount;
  this_01 = &this->freePages;
  BVar8 = BVStatic<272UL>::Count(this_01);
  if (BVar10 != BVar8) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x192,"(freePageCount == (uint)this->GetCountOfFreePages())",
                       "freePageCount == (uint)this->GetCountOfFreePages()");
    if (!bVar6) goto LAB_0070ef9e;
    *puVar12 = 0;
  }
  BVar10 = this->decommitPageCount;
  this_00 = &this->decommitPages;
  BVar8 = BVStatic<272UL>::Count(this_00);
  if (BVar10 != BVar8) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x193,"(decommitPageCount == (uint)this->GetCountOfDecommitPages())",
                       "decommitPageCount == (uint)this->GetCountOfDecommitPages()");
    if (!bVar6) goto LAB_0070ef9e;
    *puVar12 = 0;
  }
  if (this->decommitPageCount == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x194,"(decommitPageCount != 0)","decommitPageCount != 0");
    if (!bVar6) goto LAB_0070ef9e;
    *puVar12 = 0;
  }
  if (pageCount <= this->decommitPageCount + this->freePageCount) {
    pSVar3 = (this->super_SegmentBase<Memory::VirtualAllocWrapper>).secondaryAllocator;
    if ((pSVar3 != (SecondaryAllocator *)0x0) &&
       (iVar9 = (*pSVar3->_vptr_SecondaryAllocator[3])(), (char)iVar9 == '\0')) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0x199,
                         "(this->secondaryAllocator == nullptr || this->secondaryAllocator->CanAllocate())"
                         ,
                         "this->secondaryAllocator == nullptr || this->secondaryAllocator->CanAllocate()"
                        );
      if (!bVar6) {
LAB_0070ef9e:
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      *puVar12 = 0;
    }
    freeAndDecommitPages.data[3] = freePages.data[4];
    freeAndDecommitPages.data[1] = freePages.data[2];
    freeAndDecommitPages.data[2] = freePages.data[3];
    auStack_88 = (undefined1  [8])freePages.data[0].word;
    freeAndDecommitPages.data[0] = freePages.data[1];
    lVar14 = 0;
    do {
      puVar1 = (ulong *)((long)(freeAndDecommitPages.data + -1) + lVar14);
      *puVar1 = *puVar1 | *(ulong *)((long)&decommitPages.data[0].word + lVar14);
      lVar14 = lVar14 + 8;
    } while (lVar14 != 0x28);
    uVar2 = this->freePageCount;
    BVar10 = BVStatic<272UL>::GetNextBit((BVStatic<272UL> *)auStack_88,0);
    if (BVar10 == 0xffffffff) {
      return (char *)0x0;
    }
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    freeAndDecommitPages.data[4].word = (ulong)pageCount;
    do {
      pPVar4 = (this->super_SegmentBase<Memory::VirtualAllocWrapper>).super_SegmentBaseCommon.
               allocator;
      pAVar15 = &pPVar4[-1].allocatorType;
      if (pPVar4 == (PageAllocatorBaseCommon *)0x0) {
        pAVar15 = (AllocatorType *)0x0;
      }
      if (pAVar15[0x28] <= BVar10) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar12 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                           ,0x1a3,"(index < this->GetAllocator()->GetMaxAllocPageCount())",
                           "index < this->GetAllocator()->GetMaxAllocPageCount()");
        if (!bVar6) goto LAB_0070ef9e;
        *puVar12 = 0;
      }
      uVar11 = GetAvailablePageCount(this);
      if (uVar11 - BVar10 < pageCount) {
        return (char *)0x0;
      }
      if ((pageCount == 1) ||
         (BVar7 = BVStatic<272UL>::TestRange((BVStatic<272UL> *)auStack_88,BVar10,pageCount),
         BVar7 != '\0')) {
        lpAddress = (this->super_SegmentBase<Memory::VirtualAllocWrapper>).address + (BVar10 << 0xc)
        ;
        pPVar4 = (this->super_SegmentBase<Memory::VirtualAllocWrapper>).super_SegmentBaseCommon.
                 allocator;
        this_02 = (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                   *)&pPVar4[-1].allocatorType;
        if (pPVar4 == (PageAllocatorBaseCommon *)0x0) {
          this_02 = (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                     *)0x0;
        }
        PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
        ::GetVirtualAllocator(this_02);
        pPVar4 = (this->super_SegmentBase<Memory::VirtualAllocWrapper>).super_SegmentBaseCommon.
                 allocator;
        pAVar15 = &pPVar4[-1].allocatorType;
        if (pPVar4 == (PageAllocatorBaseCommon *)0x0) {
          pAVar15 = (AllocatorType *)0x0;
        }
        pcVar13 = (char *)VirtualAllocWrapper::AllocPages
                                    ((VirtualAllocWrapper *)&VirtualAllocWrapper::Instance,lpAddress
                                     ,freeAndDecommitPages.data[4].word,0x1000,4,pAVar15[0x50] == 2)
        ;
        if (pcVar13 == (char *)0x0) {
          bVar6 = pageCount != 1;
          if (pageCount == 1) {
            unaff_R12 = (char *)0x0;
          }
        }
        else {
          if (pcVar13 != lpAddress) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar12 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                               ,0x1be,"(ret == pages)","ret == pages");
            if (!bVar6) goto LAB_0070ef9e;
            *puVar12 = 0;
          }
          BVStatic<272UL>::ClearRange(this_01,BVar10,pageCount);
          BVStatic<272UL>::ClearRange(this_00,BVar10,pageCount);
          BVar8 = BVStatic<272UL>::Count(this_01);
          BVar16 = (this->freePageCount - uVar2) + BVar8;
          this->freePageCount = BVar16;
          this->decommitPageCount = this->decommitPageCount + (uVar2 - (BVar8 + pageCount));
          BVar8 = BVStatic<272UL>::Count(this_01);
          if (BVar16 != BVar8) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar12 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                               ,0x1c7,"(freePageCount == (uint)this->GetCountOfFreePages())",
                               "freePageCount == (uint)this->GetCountOfFreePages()");
            if (!bVar6) goto LAB_0070ef9e;
            *puVar12 = 0;
          }
          BVar8 = this->decommitPageCount;
          BVar16 = BVStatic<272UL>::Count(this_00);
          if (BVar8 != BVar16) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar12 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                               ,0x1c8,"(decommitPageCount == (uint)this->GetCountOfDecommitPages())"
                               ,"decommitPageCount == (uint)this->GetCountOfDecommitPages()");
            if (!bVar6) goto LAB_0070ef9e;
            *puVar12 = 0;
          }
          unaff_R12 = lpAddress;
          bVar6 = false;
        }
        if (!bVar6) {
          return unaff_R12;
        }
      }
      BVar10 = BVStatic<272UL>::GetNextBit((BVStatic<272UL> *)auStack_88,BVar10 + 1);
    } while (BVar10 != 0xffffffff);
  }
  return (char *)0x0;
}

Assistant:

char *
PageSegmentBase<TVirtualAlloc>::AllocDecommitPages(uint pageCount, T freePages, T decommitPages)
{
    Assert(freePageCount == (uint)this->GetCountOfFreePages());
    Assert(decommitPageCount ==  (uint)this->GetCountOfDecommitPages());
    Assert(decommitPageCount != 0);
    if (freePageCount + decommitPageCount < pageCount)
    {
        return nullptr;
    }
    Assert(this->secondaryAllocator == nullptr || this->secondaryAllocator->CanAllocate());

    T freeAndDecommitPages = freePages;

    freeAndDecommitPages.Or(&decommitPages);

    uint oldFreePageCount = freePageCount;
    uint index = freeAndDecommitPages.GetNextBit(0);
    while (index != -1)
    {
        Assert(index < this->GetAllocator()->GetMaxAllocPageCount());

        if (GetAvailablePageCount() - index < pageCount)
        {
            break;
        }
        if (pageCount == 1 || freeAndDecommitPages.TestRange(index, pageCount))
        {
            char * pages = this->address + index * AutoSystemInfo::PageSize;

            if (!notPageAligned)
            {
                uint nextIndex = 0;
                if (!IsAllocationPageAligned(pages, pageCount, &nextIndex))
                {
                    if (index + nextIndex >= this->GetAllocator()->GetMaxAllocPageCount())
                    {
                        return nullptr;
                    }
                    index = freeAndDecommitPages.GetNextBit(index + nextIndex);
                    continue;
                }
            }

            void * ret = this->GetAllocator()->GetVirtualAllocator()->AllocPages(pages, pageCount, MEM_COMMIT, PAGE_READWRITE, this->IsInCustomHeapAllocator());
            if (ret != nullptr)
            {
                Assert(ret == pages);

                this->ClearRangeInFreePagesBitVector(index, pageCount);
                this->ClearRangeInDecommitPagesBitVector(index, pageCount);

                uint newFreePageCount = this->GetCountOfFreePages();
                freePageCount = freePageCount - oldFreePageCount + newFreePageCount;
                decommitPageCount -= pageCount - (oldFreePageCount - newFreePageCount);

                Assert(freePageCount == (uint)this->GetCountOfFreePages());
                Assert(decommitPageCount == (uint)this->GetCountOfDecommitPages());

                return pages;
            }
            else if (pageCount == 1)
            {
                // if we failed to commit one page, we should just give up.
                return nullptr;
            }
        }
        index = freeAndDecommitPages.GetNextBit(index + 1);
    }

    return nullptr;
}